

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

void xfer_setup(Curl_easy *data,int sockindex,curl_off_t size,_Bool getheader,int writesockindex,
               _Bool shutdown,_Bool shutdown_err_ignore)

{
  connectdata *conn_00;
  _Bool _Var1;
  _Bool _Var2;
  curl_socket_t local_64;
  curl_socket_t local_60;
  curl_socket_t local_5c;
  curl_socket_t local_58;
  _Bool want_send;
  connectdata *conn;
  SingleRequest *k;
  int local_28;
  _Bool shutdown_err_ignore_local;
  _Bool shutdown_local;
  int writesockindex_local;
  _Bool getheader_local;
  curl_off_t size_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  _Var1 = Curl_req_want_send(data);
  _Var2 = Curl_conn_is_multiplex(conn_00,0);
  local_28 = writesockindex;
  if ((_Var2) || (_Var1)) {
    if (sockindex == -1) {
      if (writesockindex == -1) {
        local_58 = -1;
      }
      else {
        local_58 = conn_00->sock[writesockindex];
      }
      local_5c = local_58;
    }
    else {
      local_5c = conn_00->sock[sockindex];
    }
    conn_00->sockfd = local_5c;
    conn_00->writesockfd = conn_00->sockfd;
    if (_Var1) {
      local_28 = 0;
    }
  }
  else {
    if (sockindex == -1) {
      local_60 = -1;
    }
    else {
      local_60 = conn_00->sock[sockindex];
    }
    conn_00->sockfd = local_60;
    if (writesockindex == -1) {
      local_64 = -1;
    }
    else {
      local_64 = conn_00->sock[writesockindex];
    }
    conn_00->writesockfd = local_64;
  }
  *(uint *)&(data->req).field_0xd1 =
       *(uint *)&(data->req).field_0xd1 & 0xfffeffff | (uint)getheader << 0x10;
  (data->req).size = size;
  *(uint *)&(data->req).field_0xd1 =
       *(uint *)&(data->req).field_0xd1 & 0xffefffff | (uint)shutdown << 0x14;
  *(uint *)&(data->req).field_0xd1 =
       *(uint *)&(data->req).field_0xd1 & 0xffdfffff | (uint)shutdown_err_ignore << 0x15;
  if (((*(uint *)&(data->req).field_0xd1 >> 0x10 & 1) == 0) &&
     (*(uint *)&(data->req).field_0xd1 = *(uint *)&(data->req).field_0xd1 & 0xfffffffe, 0 < size)) {
    Curl_pgrsSetDownloadSize(data,size);
  }
  if (((*(uint *)&(data->req).field_0xd1 >> 0x10 & 1) != 0) ||
     ((*(uint *)&(data->req).field_0xd1 >> 0x11 & 1) == 0)) {
    if (sockindex != -1) {
      (data->req).keepon = (data->req).keepon | 1;
    }
    if (local_28 != -1) {
      (data->req).keepon = (data->req).keepon | 2;
    }
  }
  return;
}

Assistant:

static void xfer_setup(
  struct Curl_easy *data,   /* transfer */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  int writesockindex,       /* socket index to write to, it may be the same we
                               read from. -1 disables */
  bool shutdown,            /* shutdown connection at transfer end. Only
                             * supported when sending OR receiving. */
  bool shutdown_err_ignore  /* errors during shutdown do not fail the
                             * transfer */
  )
{
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  bool want_send = Curl_req_want_send(data);

  DEBUGASSERT(conn != NULL);
  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));
  DEBUGASSERT((writesockindex <= 1) && (writesockindex >= -1));
  DEBUGASSERT(!shutdown || (sockindex == -1) || (writesockindex == -1));

  if(Curl_conn_is_multiplex(conn, FIRSTSOCKET) || want_send) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
    if(want_send)
      /* special and HTTP-specific */
      writesockindex = FIRSTSOCKET;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[writesockindex];
  }

  k->getheader = getheader;
  k->size = size;
  k->shutdown = shutdown;
  k->shutdown_err_ignore = shutdown_err_ignore;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then do not do this! */
  if(k->getheader || !data->req.no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1)
      k->keepon |= KEEP_SEND;
  } /* if(k->getheader || !data->req.no_body) */

}